

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

void duckdb_zstd::BIT_flushBits(BIT_CStream_t *bitC)

{
  uint uVar1;
  size_t *psVar2;
  char *pcVar3;
  
  uVar1 = bitC->bitPos;
  psVar2 = (size_t *)bitC->ptr;
  *psVar2 = bitC->bitContainer;
  pcVar3 = (char *)((long)psVar2 + (ulong)(uVar1 >> 3));
  if (bitC->endPtr < pcVar3) {
    pcVar3 = bitC->endPtr;
  }
  bitC->ptr = pcVar3;
  bitC->bitPos = uVar1 & 7;
  bitC->bitContainer = bitC->bitContainer >> ((byte)uVar1 & 0x38);
  return;
}

Assistant:

MEM_STATIC void BIT_flushBits(BIT_CStream_t* bitC)
{
    size_t const nbBytes = bitC->bitPos >> 3;
    assert(bitC->bitPos < sizeof(bitC->bitContainer) * 8);
    assert(bitC->ptr <= bitC->endPtr);
    MEM_writeLEST(bitC->ptr, bitC->bitContainer);
    bitC->ptr += nbBytes;
    if (bitC->ptr > bitC->endPtr) bitC->ptr = bitC->endPtr;
    bitC->bitPos &= 7;
    bitC->bitContainer >>= nbBytes*8;
}